

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::Id<mathiu::impl::PieceWise>::Id
          (Id<mathiu::impl::PieceWise> *this,Id<mathiu::impl::PieceWise> *id)

{
  BlockT *local_78;
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_70;
  IdBlockBase<mathiu::impl::PieceWise> local_40;
  Id<mathiu::impl::PieceWise> *local_18;
  Id<mathiu::impl::PieceWise> *id_local;
  Id<mathiu::impl::PieceWise> *this_local;
  
  local_18 = id;
  id_local = this;
  IdBlockBase<mathiu::impl::PieceWise>::IdBlockBase(&local_40);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>
  ::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,void,void,matchit::impl::IdBlock<mathiu::impl::PieceWise>,void>
            ((variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>
              *)this,(IdBlock<mathiu::impl::PieceWise> *)&local_40);
  IdBlock<mathiu::impl::PieceWise>::~IdBlock((IdBlock<mathiu::impl::PieceWise> *)&local_40);
  local_78 = block(local_18);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>
  ::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>*,void,void,matchit::impl::IdBlock<mathiu::impl::PieceWise>*,void>
            ((variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>
              *)&local_70,&local_78);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::operator=(&this->mBlock,&local_70);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~variant(&local_70);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }